

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::analyse_C0_program(Analyser *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  iterator iVar4;
  string *this_00;
  Error *this_01;
  optional<Token> next;
  _Optional_payload_base<Token> local_c8;
  any local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tokenValue;
  string local_70;
  string local_50 [32];
  
  do {
    nextToken(&next,this);
    if ((next.super__Optional_base<Token,_false,_false>._M_payload.
         super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
         _M_engaged != true) ||
       (next.super__Optional_base<Token,_false,_false>._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type != RESERVED_WORD)) {
      unreadToken(this);
LAB_0010e925:
      std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&next);
      break;
    }
    std::any::any((any *)&local_c8,
                  &next.super__Optional_base<Token,_false,_false>._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value);
    std::any_cast<std::__cxx11::string>(&tokenValue,(any *)&local_c8);
    std::any::reset((any *)&local_c8);
    bVar2 = std::operator==(&tokenValue,"const");
    if (bVar2) {
      nextToken((optional<Token> *)&local_c8,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)&next,&local_c8);
      std::_Optional_payload_base<Token>::_M_reset(&local_c8);
      if (next.super__Optional_base<Token,_false,_false>._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      std::any::any(&local_a0,
                    &next.super__Optional_base<Token,_false,_false>._M_payload.
                     super__Optional_payload<Token,_true,_false,_false>.
                     super__Optional_payload_base<Token>._M_payload._M_value._value);
      std::any_cast<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                 &local_a0);
      std::__cxx11::string::operator=((string *)&tokenValue,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::any::reset(&local_a0);
    }
    bVar3 = std::operator==(&tokenValue,"void");
    if (bVar3) {
LAB_0010e913:
      unreadToken(this);
      std::__cxx11::string::~string((string *)&tokenValue);
      goto LAB_0010e925;
    }
    bVar3 = std::operator==(&tokenValue,"int");
    if (bVar3) {
      nextToken((optional<Token> *)&local_c8,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)&next,&local_c8);
      std::_Optional_payload_base<Token>::_M_reset(&local_c8);
      if ((next.super__Optional_base<Token,_false,_false>._M_payload.
           super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
           _M_engaged == true) &&
         (next.super__Optional_base<Token,_false,_false>._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type == IDENTIFIER)) {
        nextToken((optional<Token> *)&local_c8,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)&next,&local_c8);
        std::_Optional_payload_base<Token>::_M_reset(&local_c8);
        if ((next.super__Optional_base<Token,_false,_false>._M_payload.
             super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
             _M_engaged != false) &&
           ((next.super__Optional_base<Token,_false,_false>._M_payload.
             super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
             _M_payload._M_value._type == ASSIGNMENT_SIGN ||
            (next.super__Optional_base<Token,_false,_false>._M_payload.
             super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
             _M_payload._M_value._type == SEMICOLON)))) goto LAB_0010e8b2;
        unreadToken(this);
      }
      unreadToken(this);
      goto LAB_0010e913;
    }
LAB_0010e8b2:
    if (bVar2) {
      unreadToken(this);
    }
    unreadToken(this);
    unreadToken(this);
    unreadToken(this);
    std::__cxx11::string::~string((string *)&tokenValue);
    std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&next);
    bVar2 = analyse_variable_declaration(this);
  } while (bVar2);
  do {
    bVar2 = analyse_function_definition(this);
  } while (bVar2);
  nextToken(&next,this);
  if (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged == true) {
    this_00 = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,"Redundant tail",(allocator<char> *)&local_c8);
    iVar1 = this->_currentLine;
    std::__cxx11::string::string(this_00,local_50);
    *(long *)(this_00 + 0x20) = (long)iVar1;
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"main",(allocator<char> *)&tokenValue);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->_functions)._M_t,(key_type *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->_functions)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = (Error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Must have main()",(allocator<char> *)&local_c8);
    Error::Error(this_01,&local_70);
    __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
  }
  std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&next);
  return;
}

Assistant:

void Analyser::analyse_C0_program() {
	do {
		//Ԥ����ȷ���Ƿ�Ϊ������������
		bool isConst = false;
		auto next = nextToken();
		if (!next.has_value() || (next.value().GetType() != TokenType::RESERVED_WORD)) {
			unreadToken();
			break;
		}
		auto tokenValue = std::any_cast<std::string>(next.value().GetValue());
		if (tokenValue == "const") {
			isConst = true;
			next = nextToken();
			tokenValue = std::any_cast<std::string>(next.value().GetValue());
		}
		if (tokenValue == "void") {
			unreadToken();
			break;
		}
		if (tokenValue == "int") {
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				unreadToken();
				unreadToken();
				break;
			}
			next = nextToken();
			if (!next.has_value()) {
				unreadToken();
				unreadToken();
				unreadToken();
				break;
			}
			if ((next.value().GetType() != TokenType::ASSIGNMENT_SIGN) && (next.value().GetType() != TokenType::SEMICOLON)) {
				unreadToken();
				unreadToken();
				unreadToken();
				break;
			}
		}
		if (isConst) {
			unreadToken();
		}
		unreadToken();
		unreadToken();
		unreadToken();
	} while (analyse_variable_declaration());
	while (analyse_function_definition()) {}
	auto next = nextToken();
	if (next.has_value()) {
		throw Error("Redundant tail", _currentLine);
	}
	if (_functions.find("main") == _functions.end()) {
		throw Error("Must have main()");
	}
}